

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::JitAllocator::shrink(JitAllocator *this,Span *span,size_t newSize)

{
  Error EVar1;
  
  if ((JitAllocatorPrivateImpl *)this->_impl == (JitAllocatorPrivateImpl *)JitAllocatorImpl_none) {
    EVar1 = 5;
  }
  else if (span->_rx == (void *)0x0) {
    EVar1 = 2;
  }
  else {
    if (newSize != 0) {
      EVar1 = JitAllocatorImpl_shrink((JitAllocatorPrivateImpl *)this->_impl,span,newSize,false);
      return EVar1;
    }
    EVar1 = release(this,span->_rx);
    span->_rx = (void *)0x0;
    span->_rw = (void *)0x0;
    span->_size = 0;
    span->_block = (void *)0x0;
    span->_flags = kNone;
    span->_reserved = 0;
  }
  return EVar1;
}

Assistant:

Error JitAllocator::shrink(Span& span, size_t newSize) noexcept {
  if (ASMJIT_UNLIKELY(_impl == &JitAllocatorImpl_none))
    return DebugUtils::errored(kErrorNotInitialized);

  if (ASMJIT_UNLIKELY(!span.rx()))
    return DebugUtils::errored(kErrorInvalidArgument);

  if (ASMJIT_UNLIKELY(newSize == 0)) {
    Error err = release(span.rx());
    span = Span{};
    return err;
  }

  return JitAllocatorImpl_shrink(static_cast<JitAllocatorPrivateImpl*>(_impl), span, newSize, false);
}